

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aeron.cpp
# Opt level: O2

ptr_t __thiscall aeron::Aeron::mapCncFile(Aeron *this,Context *context)

{
  int __val;
  long lVar1;
  longlong lVar2;
  int64_t iVar3;
  int *piVar4;
  longlong lVar5;
  DriverTimeoutException *pDVar6;
  char *pcVar7;
  IllegalStateException *this_00;
  Context *in_RDX;
  ptr_t pVar8;
  allocator local_103;
  allocator local_102;
  allocator local_101;
  Aeron *local_100;
  string local_f8;
  ManyToOneRingBuffer ringBuffer;
  string local_a8;
  string local_88;
  __shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2> local_58;
  AtomicBuffer toDriverBuffer;
  
  lVar2 = currentTimeMillis();
  this->_vptr_Aeron = (_func_int **)0x0;
  (this->m_randomDevice).field_0.field_0._M_file = (void *)0x0;
  local_100 = this;
  while( true ) {
    while( true ) {
      Context::cncFileName_abi_cxx11_((string *)&ringBuffer,in_RDX);
      iVar3 = util::MemoryMappedFile::getFileSize((char *)ringBuffer.m_buffer);
      std::__cxx11::string::~string((string *)&ringBuffer);
      if (0 < iVar3) break;
      lVar5 = currentTimeMillis();
      if (in_RDX->m_mediaDriverTimeout + lVar2 < lVar5) {
        pDVar6 = (DriverTimeoutException *)__cxa_allocate_exception(0x48);
        Context::cncFileName_abi_cxx11_(&local_f8,in_RDX);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &ringBuffer,"CnC file not created: ",&local_f8);
        std::__cxx11::string::string
                  ((string *)&local_88,"MemoryMappedFile::ptr_t aeron::Aeron::mapCncFile(Context &)"
                   ,(allocator *)&toDriverBuffer);
        pcVar7 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                                   ,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/Aeron.cpp"
                                  );
        std::__cxx11::string::string((string *)&local_a8,pcVar7,&local_103);
        util::DriverTimeoutException::DriverTimeoutException
                  (pDVar6,(string *)&ringBuffer,&local_88,&local_a8,0x69);
        __cxa_throw(pDVar6,&util::DriverTimeoutException::typeinfo,
                    util::SourcedException::~SourcedException);
      }
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)&IDLE_SLEEP_MS_16);
    }
    Context::cncFileName_abi_cxx11_((string *)&ringBuffer,in_RDX);
    util::MemoryMappedFile::mapExisting((MemoryMappedFile *)&local_f8,(char *)ringBuffer.m_buffer);
    std::__shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2> *)local_100,
               (__shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2> *)&local_f8)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f8._M_string_length);
    std::__cxx11::string::~string((string *)&ringBuffer);
    while( true ) {
      std::__shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_68,
                 (__shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2> *)
                 local_100);
      piVar4 = (int *)util::MemoryMappedFile::getMemoryPtr(local_68._M_ptr);
      util::MemoryMappedFile::getMemorySize(local_68._M_ptr);
      __val = *piVar4;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
      if (__val != 0) break;
      lVar5 = currentTimeMillis();
      if (in_RDX->m_mediaDriverTimeout + lVar2 < lVar5) {
        pDVar6 = (DriverTimeoutException *)__cxa_allocate_exception(0x48);
        Context::cncFileName_abi_cxx11_(&local_f8,in_RDX);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &ringBuffer,"CnC file is created but not initialised: ",&local_f8);
        std::__cxx11::string::string
                  ((string *)&local_88,"MemoryMappedFile::ptr_t aeron::Aeron::mapCncFile(Context &)"
                   ,(allocator *)&toDriverBuffer);
        pcVar7 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                                   ,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/Aeron.cpp"
                                  );
        std::__cxx11::string::string((string *)&local_a8,pcVar7,&local_103);
        util::DriverTimeoutException::DriverTimeoutException
                  (pDVar6,(string *)&ringBuffer,&local_88,&local_a8,0x78);
        __cxa_throw(pDVar6,&util::DriverTimeoutException::typeinfo,
                    util::SourcedException::~SourcedException);
      }
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)&IDLE_SLEEP_MS_1);
    }
    if (__val != 0xf) {
      this_00 = (IllegalStateException *)__cxa_allocate_exception(0x48);
      std::__cxx11::to_string(&local_f8,__val);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &ringBuffer,"CnC file version not supported: ",&local_f8);
      std::__cxx11::string::string
                ((string *)&local_88,"MemoryMappedFile::ptr_t aeron::Aeron::mapCncFile(Context &)",
                 (allocator *)&toDriverBuffer);
      pcVar7 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                                 ,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/Aeron.cpp"
                                );
      std::__cxx11::string::string((string *)&local_a8,pcVar7,&local_103);
      util::IllegalStateException::IllegalStateException
                (this_00,(string *)&ringBuffer,&local_88,&local_a8,0x81);
      __cxa_throw(this_00,&util::IllegalStateException::typeinfo,
                  util::SourcedException::~SourcedException);
    }
    std::__shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_58,
               (__shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2> *)local_100)
    ;
    CncFileDescriptor::createToDriverBuffer(&toDriverBuffer,(ptr_t *)&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    concurrent::ringbuffer::ManyToOneRingBuffer::ManyToOneRingBuffer(&ringBuffer,&toDriverBuffer);
    while( true ) {
      lVar1 = *(long *)((ringBuffer.m_buffer)->m_buffer + ringBuffer.m_consumerHeartbeatIndex);
      lVar5 = currentTimeMillis();
      if (lVar1 != 0) break;
      if (in_RDX->m_mediaDriverTimeout + lVar2 < lVar5) {
        pDVar6 = (DriverTimeoutException *)__cxa_allocate_exception(0x48);
        std::__cxx11::string::string((string *)&local_f8,"no driver heartbeat detected",&local_103);
        std::__cxx11::string::string
                  ((string *)&local_88,"MemoryMappedFile::ptr_t aeron::Aeron::mapCncFile(Context &)"
                   ,&local_101);
        pcVar7 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                                   ,
                                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/Aeron.cpp"
                                  );
        std::__cxx11::string::string((string *)&local_a8,pcVar7,&local_102);
        util::DriverTimeoutException::DriverTimeoutException
                  (pDVar6,&local_f8,&local_88,&local_a8,0x8b);
        __cxa_throw(pDVar6,&util::DriverTimeoutException::typeinfo,
                    util::SourcedException::~SourcedException);
      }
      std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                ((duration<long,_std::ratio<1L,_1000L>_> *)&IDLE_SLEEP_MS_1);
    }
    if (lVar5 - in_RDX->m_mediaDriverTimeout <=
        (long)*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((ringBuffer.m_buffer)->m_buffer + ringBuffer.m_consumerHeartbeatIndex)) {
      pVar8.super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
            ((ringBuffer.m_buffer)->m_buffer + ringBuffer.m_consumerHeartbeatIndex);
      pVar8.super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_100;
      return (ptr_t)pVar8.
                    super___shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>;
    }
    if (in_RDX->m_mediaDriverTimeout + lVar2 < lVar5) break;
    local_f8._M_dataplus._M_p = (pointer)0x0;
    local_f8._M_string_length = 0;
    std::__shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2> *)local_100,
               (__shared_ptr<aeron::util::MemoryMappedFile,_(__gnu_cxx::_Lock_policy)2> *)&local_f8)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f8._M_string_length);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)&IDLE_SLEEP_MS_100);
  }
  pDVar6 = (DriverTimeoutException *)__cxa_allocate_exception(0x48);
  std::__cxx11::string::string((string *)&local_f8,"no driver heartbeat detected",&local_103);
  std::__cxx11::string::string
            ((string *)&local_88,"MemoryMappedFile::ptr_t aeron::Aeron::mapCncFile(Context &)",
             &local_101);
  pcVar7 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                             ,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/Aeron.cpp"
                            );
  std::__cxx11::string::string((string *)&local_a8,pcVar7,&local_102);
  util::DriverTimeoutException::DriverTimeoutException(pDVar6,&local_f8,&local_88,&local_a8,0x96);
  __cxa_throw(pDVar6,&util::DriverTimeoutException::typeinfo,
              util::SourcedException::~SourcedException);
}

Assistant:

inline MemoryMappedFile::ptr_t Aeron::mapCncFile(Context &context)
{
    const long long startMs = currentTimeMillis();
    MemoryMappedFile::ptr_t cncBuffer;

    while (true)
    {
        while (MemoryMappedFile::getFileSize(context.cncFileName().c_str()) <= 0)
        {
            if (currentTimeMillis() > (startMs + context.m_mediaDriverTimeout))
            {
                throw DriverTimeoutException("CnC file not created: " + context.cncFileName(), SOURCEINFO);
            }

            std::this_thread::sleep_for(IDLE_SLEEP_MS_16);
        }

        cncBuffer = MemoryMappedFile::mapExisting(context.cncFileName().c_str());

        std::int32_t cncVersion = 0;

        while (0 == (cncVersion = CncFileDescriptor::cncVersionVolatile(cncBuffer)))
        {
            if (currentTimeMillis() > (startMs + context.m_mediaDriverTimeout))
            {
                throw DriverTimeoutException(
                    "CnC file is created but not initialised: " + context.cncFileName(), SOURCEINFO);
            }

            std::this_thread::sleep_for(IDLE_SLEEP_MS_1);
        }

        if (CncFileDescriptor::CNC_VERSION != cncVersion)
        {
            throw util::IllegalStateException(
                "CnC file version not supported: " + std::to_string(cncVersion), SOURCEINFO);
        }

        AtomicBuffer toDriverBuffer(CncFileDescriptor::createToDriverBuffer(cncBuffer));
        ManyToOneRingBuffer ringBuffer(toDriverBuffer);

        while (0 == ringBuffer.consumerHeartbeatTime())
        {
            if (currentTimeMillis() > (startMs + context.m_mediaDriverTimeout))
            {
                throw DriverTimeoutException(std::string("no driver heartbeat detected"), SOURCEINFO);
            }

            std::this_thread::sleep_for(IDLE_SLEEP_MS_1);
        }

        const long long timeMs = currentTimeMillis();
        if (ringBuffer.consumerHeartbeatTime() < (timeMs - context.m_mediaDriverTimeout))
        {
            if (timeMs > (startMs + context.m_mediaDriverTimeout))
            {
                throw DriverTimeoutException(std::string("no driver heartbeat detected"), SOURCEINFO);
            }

            cncBuffer = nullptr;

            std::this_thread::sleep_for(IDLE_SLEEP_MS_100);
            continue;
        }

        break;
    }

    return cncBuffer;
}